

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * vera::toLuma(Image *__return_storage_ptr__,Image *_image)

{
  uint _width;
  uint _height;
  int iVar1;
  undefined4 extraout_var;
  int x;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float _data;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_40;
  
  _width = (*_image->_vptr_Image[6])(_image);
  _height = (*_image->_vptr_Image[7])(_image);
  Image::Image(__return_storage_ptr__,_width,_height,1);
  uVar4 = 0;
  uVar5 = (ulong)_width;
  if ((int)_width < 1) {
    uVar5 = uVar4;
  }
  uVar3 = (ulong)_height;
  if ((int)_height < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = (*_image->_vptr_Image[0xe])(_image,uVar2,uVar4);
      (*_image->_vptr_Image[0x19])(_image,CONCAT44(extraout_var,iVar1));
      local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3e59b3d0;
      local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f371759;
      local_50.field_2.z = 0.0722;
      _data = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                        (&local_40,&local_50);
      Image::setValue(__return_storage_ptr__,
                      (long)__return_storage_ptr__->m_channels *
                      ((long)__return_storage_ptr__->m_width * uVar4 + uVar2),_data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image toLuma(const Image& _image) {
    int width = _image.getWidth();
    int height = _image.getHeight();

    Image out = Image(width, height, 1);
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
            glm::vec4 c = _image.getColor( _image.getIndex(x, y) );
            float value = glm::dot(glm::vec3(c.x, c.y, c.z), glm::vec3(0.2126f, 0.7152f, 0.0722f));
            out.setValue( out.getIndex(x, y), value);
        }
    }

    return out;
}